

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void build_wedge_inter_predictor_from_buf
               (MACROBLOCKD *xd,int plane,int x,int y,int w,int h,uint8_t *ext_dst0,
               int ext_dst_stride0,uint8_t *ext_dst1,int ext_dst_stride1)

{
  int src0_stride;
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  MACROBLOCKD *in_RDI;
  int in_R8D;
  int in_R9D;
  INTERINTER_COMPOUND_DATA *unaff_retaddr;
  BLOCK_SIZE in_stack_00000008;
  undefined7 in_stack_00000009;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  BLOCK_SIZE BStack0000000000000018;
  undefined4 in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int is_hbd;
  INTERINTER_COMPOUND_DATA *comp_data;
  uint8_t *dst;
  buf_2d *dst_buf;
  MACROBLOCKD_PLANE *pd;
  int is_compound;
  MB_MODE_INFO *mbmi;
  buf_2d *src1;
  macroblockd_plane *src1_8;
  undefined4 in_stack_ffffffffffffffc0;
  MB_MODE_INFO *mbmi_00;
  MB_MODE_INFO *src0_8;
  undefined4 in_stack_ffffffffffffffd0;
  
  mbmi_00 = *in_RDI->mi;
  src0_stride = has_second_ref(mbmi_00);
  src1_8 = in_RDI->plane + in_ESI;
  src1 = &src1_8->dst;
  puVar3 = src1->buf + (long)in_EDX + (long)((src1_8->dst).stride * in_ECX);
  (mbmi_00->interinter_comp).seg_mask = in_RDI->seg_mask;
  src0_8 = mbmi_00;
  iVar1 = is_cur_buf_hbd(in_RDI);
  if ((src0_stride == 0) ||
     (iVar2 = is_masked_compound_type((mbmi_00->interinter_comp).type), iVar2 == 0)) {
    if (iVar1 == 0) {
      (*aom_convolve_copy)
                ((uint8_t *)CONCAT71(in_stack_00000009,in_stack_00000008),(long)in_stack_00000010,
                 puVar3,(long)src1->stride,in_R8D,in_R9D);
    }
    else {
      (*aom_highbd_convolve_copy)
                ((uint16_t *)(CONCAT71(in_stack_00000009,in_stack_00000008) << 1),
                 (long)in_stack_00000010,(uint16_t *)((long)puVar3 << 1),(long)src1->stride,in_R8D,
                 in_R9D);
    }
  }
  else {
    if ((in_ESI == 0) && ((mbmi_00->interinter_comp).type == '\x03')) {
      if (iVar1 == 0) {
        (*av1_build_compound_diffwtd_mask)
                  ((mbmi_00->interinter_comp).seg_mask,(mbmi_00->interinter_comp).mask_type,
                   (uint8_t *)CONCAT71(in_stack_00000009,in_stack_00000008),in_stack_00000010,
                   (uint8_t *)CONCAT44(in_stack_0000001c,_BStack0000000000000018),in_stack_00000020,
                   in_R9D,in_R8D);
      }
      else {
        (*av1_build_compound_diffwtd_mask_highbd)
                  ((mbmi_00->interinter_comp).seg_mask,(mbmi_00->interinter_comp).mask_type,
                   (uint8_t *)(CONCAT71(in_stack_00000009,in_stack_00000008) >> 1),in_stack_00000010
                   ,(uint8_t *)(CONCAT44(in_stack_0000001c,_BStack0000000000000018) >> 1),
                   in_stack_00000020,in_R9D,in_R8D,in_RDI->bd);
      }
    }
    if (iVar1 == 0) {
      build_masked_compound
                ((uint8_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),(int)((ulong)src0_8 >> 0x20),
                 (uint8_t *)CONCAT44(src0_stride,in_stack_ffffffffffffffc0),
                 (int)((ulong)src1_8 >> 0x20),(uint8_t *)src1,(int)((ulong)puVar3 >> 0x20),
                 unaff_retaddr,in_stack_00000008,in_stack_00000010,_BStack0000000000000018);
    }
    else {
      build_masked_compound_highbd
                ((uint8_t *)CONCAT44(in_ECX,in_R8D),in_R9D,&src0_8->bsize,src0_stride,
                 &src1_8->plane_type,(int)((ulong)src1 >> 0x20),
                 (INTERINTER_COMPOUND_DATA *)CONCAT44(in_stack_00000014,in_stack_00000010),
                 BStack0000000000000018,in_stack_00000020,in_stack_00000028,in_stack_00000030);
    }
  }
  return;
}

Assistant:

static void build_wedge_inter_predictor_from_buf(
    MACROBLOCKD *xd, int plane, int x, int y, int w, int h, uint8_t *ext_dst0,
    int ext_dst_stride0, uint8_t *ext_dst1, int ext_dst_stride1) {
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int is_compound = has_second_ref(mbmi);
  MACROBLOCKD_PLANE *const pd = &xd->plane[plane];
  struct buf_2d *const dst_buf = &pd->dst;
  uint8_t *const dst = dst_buf->buf + dst_buf->stride * y + x;
  mbmi->interinter_comp.seg_mask = xd->seg_mask;
  const INTERINTER_COMPOUND_DATA *comp_data = &mbmi->interinter_comp;
  const int is_hbd = is_cur_buf_hbd(xd);

  if (is_compound && is_masked_compound_type(comp_data->type)) {
    if (!plane && comp_data->type == COMPOUND_DIFFWTD) {
#if CONFIG_AV1_HIGHBITDEPTH
      if (is_hbd) {
        av1_build_compound_diffwtd_mask_highbd(
            comp_data->seg_mask, comp_data->mask_type,
            CONVERT_TO_BYTEPTR(ext_dst0), ext_dst_stride0,
            CONVERT_TO_BYTEPTR(ext_dst1), ext_dst_stride1, h, w, xd->bd);
      } else {
        av1_build_compound_diffwtd_mask(
            comp_data->seg_mask, comp_data->mask_type, ext_dst0,
            ext_dst_stride0, ext_dst1, ext_dst_stride1, h, w);
      }
#else
      (void)is_hbd;
      av1_build_compound_diffwtd_mask(comp_data->seg_mask, comp_data->mask_type,
                                      ext_dst0, ext_dst_stride0, ext_dst1,
                                      ext_dst_stride1, h, w);
#endif  // CONFIG_AV1_HIGHBITDEPTH
    }
#if CONFIG_AV1_HIGHBITDEPTH
    if (is_hbd) {
      build_masked_compound_highbd(
          dst, dst_buf->stride, CONVERT_TO_BYTEPTR(ext_dst0), ext_dst_stride0,
          CONVERT_TO_BYTEPTR(ext_dst1), ext_dst_stride1, comp_data, mbmi->bsize,
          h, w, xd->bd);
    } else {
      build_masked_compound(dst, dst_buf->stride, ext_dst0, ext_dst_stride0,
                            ext_dst1, ext_dst_stride1, comp_data, mbmi->bsize,
                            h, w);
    }
#else
    build_masked_compound(dst, dst_buf->stride, ext_dst0, ext_dst_stride0,
                          ext_dst1, ext_dst_stride1, comp_data, mbmi->bsize, h,
                          w);
#endif
  } else {
#if CONFIG_AV1_HIGHBITDEPTH
    if (is_hbd) {
      aom_highbd_convolve_copy(CONVERT_TO_SHORTPTR(ext_dst0), ext_dst_stride0,
                               CONVERT_TO_SHORTPTR(dst), dst_buf->stride, w, h);
    } else {
      aom_convolve_copy(ext_dst0, ext_dst_stride0, dst, dst_buf->stride, w, h);
    }
#else
    aom_convolve_copy(ext_dst0, ext_dst_stride0, dst, dst_buf->stride, w, h);
#endif
  }
}